

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaggageTest.cpp
# Opt level: O1

void __thiscall
jaegertracing::baggage::Baggage_testRemoteRestrictionManagerFunctionality_Test::
~Baggage_testRemoteRestrictionManagerFunctionality_Test
          (Baggage_testRemoteRestrictionManagerFunctionality_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Baggage, testRemoteRestrictionManagerFunctionality)
{
    auto logger = logging::consoleLogger();

    TestStatsReporter testReporter;
    auto metrics = metrics::Metrics::fromStatsReporter(testReporter);

    auto mockAgent = testutils::MockAgent::make();
    mockAgent->start();
    RemoteRestrictionManager manager(
        "test-service",
        mockAgent->samplingServerAddress().authority(),
        true,
        std::chrono::milliseconds(100),
        *logger,
        *metrics);
    ASSERT_EQ(Restriction(false, 0),
              manager.getRestriction("test-service", "abc"));
    mockAgent->addBaggageRestriction("abc", Restriction(true, 1));

    // Wait for the Update Restrictions to occur
    // This is done by listening to the number of update published via the Metrics
    // Typically, On Windows with Debug mode, the update happens after 700ms
    for (int sleepIndex = 0; sleepIndex < 100; ++sleepIndex) {
        auto counterVal = testReporter.counterValue(
            "jaeger.baggage-restrictions-update", { { "result", "ok" } });
        std::this_thread::sleep_for(std::chrono::milliseconds(200));
        if (counterVal > 0) {
            break;
        }
    }
    
    ASSERT_EQ(Restriction(true, 1),
              manager.getRestriction("test-service", "abc"));
    ASSERT_EQ(Restriction(false, 0),
              manager.getRestriction("test-service", "bcd"));
    manager.close();
}